

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall CGL::Application::mouse_event(Application *this,int key,int event,uchar mods)

{
  int in_EDX;
  int in_ESI;
  e_mouse_button in_stack_0000000c;
  undefined7 in_stack_00000010;
  e_mouse_button in_stack_0000007c;
  Application *in_stack_00000080;
  
  if (in_EDX == 0) {
    if (in_ESI == 0) {
      mouse_released(in_stack_00000080,in_stack_0000007c);
    }
    else if (in_ESI == 1) {
      mouse_released(in_stack_00000080,in_stack_0000007c);
    }
    else if (in_ESI == 2) {
      mouse_released(in_stack_00000080,in_stack_0000007c);
    }
  }
  else if (in_EDX == 1) {
    if (in_ESI == 0) {
      mouse_pressed((Application *)CONCAT17(mods,in_stack_00000010),in_stack_0000000c);
    }
    else if (in_ESI == 1) {
      mouse_pressed((Application *)CONCAT17(mods,in_stack_00000010),in_stack_0000000c);
    }
    else if (in_ESI == 2) {
      mouse_pressed((Application *)CONCAT17(mods,in_stack_00000010),in_stack_0000000c);
    }
  }
  return;
}

Assistant:

void Application::mouse_event(int key, int event, unsigned char mods) {
  switch(event) {
    case EVENT_PRESS:
      switch(key) {
        case MOUSE_LEFT:
          mouse_pressed(LEFT);
          break;
        case MOUSE_RIGHT:
          mouse_pressed(RIGHT);
          break;
        case MOUSE_MIDDLE:
          mouse_pressed(MIDDLE);
          break;
      }
      break;
    case EVENT_RELEASE:
      switch(key) {
        case MOUSE_LEFT:
          mouse_released(LEFT);
          break;
        case MOUSE_RIGHT:
          mouse_released(RIGHT);
          break;
        case MOUSE_MIDDLE:
          mouse_released(MIDDLE);
          break;
      }
      break;
  }
}